

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coptccal.cpp
# Opt level: O3

void __thiscall
icu_63::CopticCalendar::handleComputeFields
          (CopticCalendar *this,int32_t julianDay,UErrorCode *param_2)

{
  int iVar1;
  int32_t day;
  int32_t month;
  int32_t eyear;
  int local_34;
  int local_30;
  int local_2c;
  
  iVar1 = (*(this->super_CECalendar).super_Calendar.super_UObject._vptr_UObject[0x32])();
  CECalendar::jdToCE(julianDay,iVar1,&local_2c,&local_30,&local_34);
  iVar1 = 1 - local_2c;
  if (0 < local_2c) {
    iVar1 = local_2c;
  }
  (this->super_CECalendar).super_Calendar.fFields[0x13] = local_2c;
  (this->super_CECalendar).super_Calendar.fStamp[0x13] = 1;
  (this->super_CECalendar).super_Calendar.fIsSet[0x13] = '\x01';
  (this->super_CECalendar).super_Calendar.fFields[0] = (uint)(0 < local_2c);
  (this->super_CECalendar).super_Calendar.fStamp[0] = 1;
  (this->super_CECalendar).super_Calendar.fStamp[1] = 1;
  (this->super_CECalendar).super_Calendar.fIsSet[0] = '\x01';
  (this->super_CECalendar).super_Calendar.fIsSet[1] = '\x01';
  (this->super_CECalendar).super_Calendar.fFields[1] = iVar1;
  (this->super_CECalendar).super_Calendar.fFields[2] = local_30;
  (this->super_CECalendar).super_Calendar.fStamp[2] = 1;
  (this->super_CECalendar).super_Calendar.fIsSet[2] = '\x01';
  (this->super_CECalendar).super_Calendar.fFields[5] = local_34;
  (this->super_CECalendar).super_Calendar.fStamp[5] = 1;
  (this->super_CECalendar).super_Calendar.fStamp[6] = 1;
  (this->super_CECalendar).super_Calendar.fIsSet[5] = '\x01';
  (this->super_CECalendar).super_Calendar.fIsSet[6] = '\x01';
  (this->super_CECalendar).super_Calendar.fFields[6] = local_30 * 0x1e + local_34;
  return;
}

Assistant:

void
CopticCalendar::handleComputeFields(int32_t julianDay, UErrorCode &/*status*/)
{
    int32_t eyear, month, day, era, year;
    jdToCE(julianDay, getJDEpochOffset(), eyear, month, day);

    if (eyear <= 0) {
        era = BCE;
        year = 1 - eyear;
    } else {
        era = CE;
        year = eyear;
    }

    internalSet(UCAL_EXTENDED_YEAR, eyear);
    internalSet(UCAL_ERA, era);
    internalSet(UCAL_YEAR, year);
    internalSet(UCAL_MONTH, month);
    internalSet(UCAL_DATE, day);
    internalSet(UCAL_DAY_OF_YEAR, (30 * month) + day);
}